

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void handle_init_fd(int fd)

{
  int in_EDI;
  init_request request;
  int sig;
  int local_188;
  uint local_184;
  uint local_180;
  undefined4 local_8;
  int local_4;
  
  local_4 = in_EDI;
  log_write(6,"<6>init: %d %c",(ulong)local_184,(ulong)local_180);
  read(local_4,&local_188,0x180);
  if ((local_188 == 0x3091969) && (local_184 == 1)) {
    if (local_180 == 0x30) {
      local_8 = 0xc;
    }
    else if (local_180 == 0x36) {
      local_8 = 0xf;
    }
    init_reboot(local_180);
  }
  return;
}

Assistant:

static void handle_init_fd(int fd)
{
    int sig;
    struct init_request request;
INFO("%d %c", request.cmd, request.runlevel);
    read(fd, &request, sizeof(request));
    if (request.magic != INIT_MAGIC)
	    return;
    if (request.cmd == INIT_CMD_RUNLVL) {
        switch (request.runlevel) {
            case '0':
                sig = SIGUSR2;
                break;
            case '6':
                sig = SIGTERM;
                break;
        }
        init_reboot(sig);
    }
}